

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QLocalePrivate>::reset
          (QSharedDataPointer<QLocalePrivate> *this,QLocalePrivate *ptr)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  QLocalePrivate *in_RSI;
  totally_ordered_wrapper<QLocalePrivate_*> *in_RDI;
  long in_FS_OFFSET;
  QLocalePrivate *old;
  totally_ordered_wrapper<QLocalePrivate_*> *in_stack_ffffffffffffffb8;
  totally_ordered_wrapper<QLocalePrivate_*> local_18;
  totally_ordered_wrapper<QLocalePrivate_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = Qt::totally_ordered_wrapper<QLocalePrivate_*>::get(in_RDI);
  if (in_RSI != pQVar2) {
    if (in_RSI != (QLocalePrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x141170);
    }
    Qt::totally_ordered_wrapper<QLocalePrivate_*>::totally_ordered_wrapper(&local_18,in_RSI);
    local_10 = std::
               exchange<Qt::totally_ordered_wrapper<QLocalePrivate*>,Qt::totally_ordered_wrapper<QLocalePrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QLocalePrivate_*> *)0x14118e);
    pQVar2 = Qt::totally_ordered_wrapper<QLocalePrivate_*>::get(&local_10);
    if (((pQVar2 != (QLocalePrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1411b8), !bVar1)) &&
       (pQVar2 != (QLocalePrivate *)0x0)) {
      operator_delete(pQVar2,0x20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }